

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::QTextEdit(QTextEdit *this,QTextEditPrivate *dd,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,&dd->super_QAbstractScrollAreaPrivate,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_007d6c20;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTextEdit_007d6e20;
  local_28.d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  local_28.size = 0;
  QTextEditPrivate::init
            (*(QTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextEdit::QTextEdit(QTextEditPrivate &dd, QWidget *parent)
    : QAbstractScrollArea(dd, parent)
{
    Q_D(QTextEdit);
    d->init();
}